

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_parse_positive_int<int>(string *text,int *value_p)

{
  int iVar1;
  long lVar2;
  byte *pbVar3;
  int *in_RSI;
  int digit;
  uchar c;
  char *end;
  char *start;
  int vmax_over_base;
  int vmax;
  int value;
  int base;
  byte *local_30;
  int local_20;
  
  local_20 = 0;
  local_30 = (byte *)std::__cxx11::string::data();
  lVar2 = std::__cxx11::string::size();
  pbVar3 = local_30 + lVar2;
  while( true ) {
    if (pbVar3 <= local_30) {
      *in_RSI = local_20;
      return true;
    }
    iVar1 = *local_30 - 0x30;
    if ((9 < iVar1) || (iVar1 < 0)) {
      *in_RSI = local_20;
      return false;
    }
    if (0xccccccc < local_20) {
      *in_RSI = 0x7fffffff;
      return false;
    }
    if (0x7fffffff - iVar1 < local_20 * 10) break;
    local_20 = iVar1 + local_20 * 10;
    local_30 = local_30 + 1;
  }
  *in_RSI = 0x7fffffff;
  return false;
}

Assistant:

bool safe_parse_positive_int(std::string text, IntType *value_p) {
  int base = 10;
  IntType value = 0;
  const IntType vmax = std::numeric_limits<IntType>::max();
  assert(vmax > 0);
  assert(vmax >= base);
  const IntType vmax_over_base = vmax / base;
  const char* start = text.data();
  const char* end = start + text.size();
  // loop over digits
  for (; start < end; ++start) {
    unsigned char c = static_cast<unsigned char>(start[0]);
    int digit = c - '0';
    if (digit >= base || digit < 0) {
      *value_p = value;
      return false;
    }
    if (value > vmax_over_base) {
      *value_p = vmax;
      return false;
    }
    value *= base;
    if (value > vmax - digit) {
      *value_p = vmax;
      return false;
    }
    value += digit;
  }
  *value_p = value;
  return true;
}